

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

double __thiscall
ON_NurbsSurface::GetCubicBezierApproximation
          (ON_NurbsSurface *this,double max_deviation,ON_3dPoint (*bezCV) [4])

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ON_NurbsCurve *this_00;
  ON_3dPoint *pOVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  ON_NurbsSurface *pOVar8;
  bool local_791;
  double local_788;
  bool local_779;
  double *local_770;
  double **local_760;
  ON_NurbsSurface *local_738;
  ON_3dPoint *local_730;
  double d_2;
  double s1;
  double t1;
  int passj;
  int j_2;
  double s0;
  double t0;
  int passi;
  int i_1;
  ON_3dPoint nurbsP;
  ON_3dPoint bezP;
  int cv_count;
  double *k;
  int dir;
  double *g [2];
  double g_buffer [64];
  double d_1;
  ON_3dPoint bezP_1;
  double dStack_450;
  int n_2;
  double zero_tol;
  ON_3dPoint local_430;
  ON_3dPoint local_418;
  ON_3dPoint local_400;
  ON_3dPoint local_3e8;
  ON_3dPoint local_3d0;
  ON_3dPoint local_3b8;
  int local_39c;
  int n_1;
  double M [4] [4];
  ON_2dex cvdex [4];
  ON_3dPoint local_2e0;
  ON_3dVector local_2c8;
  ON_3dPoint local_2b0;
  ON_3dVector local_298;
  int local_280;
  int local_27c;
  int j_1;
  int i;
  ON_3dPoint valQ;
  ON_3dPoint K;
  double *bj;
  double *bi;
  int local_224;
  undefined4 local_220;
  int n;
  int hint [2];
  ON_3dPoint srfP [4];
  double bezuv [4] [2];
  double b [2] [4];
  ON_BezierSurface bezS;
  int j;
  double d;
  ON_NurbsCurve *nurbs_curve;
  ON_Curve *iso;
  ON_NurbsSurface *pOStack_e8;
  int side;
  double deviation;
  double maximum_deviation;
  double c [4];
  ON_Interval local_a8;
  undefined1 local_98 [8];
  ON_3dPoint Q [4];
  double failed_rc;
  ON_3dPoint (*bezCV_local) [4];
  double max_deviation_local;
  ON_NurbsSurface *this_local;
  ON_Object *p;
  
  this_local = (ON_NurbsSurface *)ON_DBL_QNAN;
  bVar2 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if (bVar2) {
  }
  else if ((this->m_order[0] < 2) || (this->m_order[1] < 2)) {
  }
  else if ((this->m_cv_count[0] < this->m_order[0]) || (0x40 < this->m_cv_count[0])) {
  }
  else if ((this->m_cv_count[1] < this->m_order[1]) || (0x40 < this->m_cv_count[1])) {
  }
  else {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    ON_Interval::operator[](&local_a8,0);
    c[0] = ON_Interval::operator[]((ON_Interval *)(c + 3),1);
    c[1] = ON_Interval::operator[](&local_a8,1);
    c[2] = ON_Interval::operator[]((ON_Interval *)(c + 3),0);
    dVar6 = ON_DBL_QNAN;
    pOStack_e8 = (ON_NurbsSurface *)0x0;
    for (iso._4_4_ = 0; iso._4_4_ < 4; iso._4_4_ = iso._4_4_ + 1) {
      iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                        (c[(long)iso._4_4_ + -1],this,(long)iso._4_4_ % 2 & 0xffffffff);
      p = (ON_Object *)CONCAT44(extraout_var,iVar3);
      if (p == (ON_Object *)0x0) {
        return (double)this_local;
      }
      this_00 = ON_NurbsCurve::Cast(p);
      if (this_00 == (ON_NurbsCurve *)0x0) {
        local_738 = (ON_NurbsSurface *)ON_DBL_QNAN;
      }
      else {
        if (iso._4_4_ % 2 == 0) {
          local_730 = (ON_3dPoint *)local_98;
        }
        else {
          iVar3 = 0;
          if (iso._4_4_ == 1) {
            iVar3 = 3;
          }
          local_730 = bezCV[iVar3];
        }
        local_738 = (ON_NurbsSurface *)
                    ON_NurbsCurve::GetCubicBezierApproximation(this_00,dVar6,local_730);
      }
      if ((double)local_738 < 0.0) {
        return (double)this_local;
      }
      if ((double)pOStack_e8 < (double)local_738) {
        pOStack_e8 = local_738;
      }
      if (iso._4_4_ % 2 == 0) {
        iVar3 = 3;
        if (iso._4_4_ == 0) {
          iVar3 = 0;
        }
        pOVar4 = bezCV[1] + iVar3;
        pOVar4->x = Q[0].z;
        pOVar4->y = Q[1].x;
        pOVar4->z = Q[1].y;
        pOVar4 = bezCV[2] + iVar3;
        pOVar4->x = Q[1].z;
        pOVar4->y = Q[2].x;
        pOVar4->z = Q[2].y;
      }
      if (p != (ON_Object *)0x0) {
        (*p->_vptr_ON_Object[4])();
      }
    }
    bezCV[1][1].x = ON_3dPoint::Origin.x;
    bezCV[1][1].y = ON_3dPoint::Origin.y;
    bezCV[1][1].z = ON_3dPoint::Origin.z;
    bezCV[1][2].x = ON_3dPoint::Origin.x;
    bezCV[1][2].y = ON_3dPoint::Origin.y;
    bezCV[1][2].z = ON_3dPoint::Origin.z;
    bezCV[2][1].x = ON_3dPoint::Origin.x;
    bezCV[2][1].y = ON_3dPoint::Origin.y;
    bezCV[2][1].z = ON_3dPoint::Origin.z;
    bezCV[2][2].x = ON_3dPoint::Origin.x;
    bezCV[2][2].y = ON_3dPoint::Origin.y;
    bezCV[2][2].z = ON_3dPoint::Origin.z;
    ON_BezierSurface::ON_BezierSurface((ON_BezierSurface *)(b[1] + 3));
    b[1][3]._0_4_ = 3;
    b[1][3]._4_4_ = 0;
    memcpy(bezuv[3] + 1,&DAT_00a02e90,0x40);
    memcpy(&srfP[3].z,&DAT_00a02ed0,0x40);
    hint = (int  [2])ON_3dPoint::Origin.x;
    srfP[0].x = ON_3dPoint::Origin.y;
    srfP[0].y = ON_3dPoint::Origin.z;
    srfP[0].z = ON_3dPoint::Origin.x;
    srfP[1].x = ON_3dPoint::Origin.y;
    srfP[1].y = ON_3dPoint::Origin.z;
    srfP[1].z = ON_3dPoint::Origin.x;
    srfP[2].x = ON_3dPoint::Origin.y;
    srfP[2].y = ON_3dPoint::Origin.z;
    srfP[2].z = ON_3dPoint::Origin.x;
    srfP[3].x = ON_3dPoint::Origin.y;
    srfP[3].y = ON_3dPoint::Origin.z;
    memset(&local_220,0,8);
    for (local_224 = 0; local_224 < 4; local_224 = local_224 + 1) {
      dVar6 = ON_Interval::ParameterAt((ON_Interval *)(c + 3),bezuv[(long)local_224 + -1][1]);
      dVar7 = ON_Interval::ParameterAt(&local_a8,bezuv[local_224][0]);
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
                (dVar6,dVar7,this,0,3,&srfP[(long)local_224 + -1].z,0,&local_220);
      ON_3dPoint::ON_3dPoint((ON_3dPoint *)&valQ.z,0.0,0.0,0.0);
      ON_3dPoint::ON_3dPoint((ON_3dPoint *)&j_1,0.0,0.0,0.0);
      for (local_27c = 0; local_27c < 4; local_27c = local_27c + 1) {
        for (local_280 = 0; local_280 < 4; local_280 = local_280 + 1) {
          if (((local_27c != 1) && (local_27c != 2)) || ((local_280 != 1 && (local_280 != 2)))) {
            ::operator*(&local_2b0,
                        b[(long)(local_224 % 2) + -1][(long)local_27c + 3] *
                        b[(long)(local_224 / 2) + -1][(long)local_280 + 3],
                        bezCV[local_27c] + local_280);
            ON_3dVector::ON_3dVector(&local_298,&local_2b0);
            ON_3dPoint::operator+=((ON_3dPoint *)&valQ.z,&local_298);
          }
        }
      }
      ::operator*(&local_2e0,2.25,(ON_3dPoint *)&srfP[(long)local_224 + -1].z);
      ON_3dPoint::operator/((ON_3dPoint *)(cvdex + 3),(ON_3dPoint *)&valQ.z,324.0);
      ON_3dPoint::operator-(&local_2c8,&local_2e0,(ON_3dPoint *)(cvdex + 3));
      ON_3dPoint::operator=((ON_3dPoint *)&Q[(long)local_224 + -1].z,&local_2c8);
    }
    ON_2dex::ON_2dex((ON_2dex *)(M[3] + 3),1,1);
    ON_2dex::ON_2dex(cvdex,2,1);
    ON_2dex::ON_2dex(cvdex + 1,1,2);
    ON_2dex::ON_2dex(cvdex + 2,2,2);
    memcpy(&stack0xfffffffffffffc68,&DAT_00a02f10,0x80);
    for (local_39c = 0; local_39c < 4; local_39c = local_39c + 1) {
      ::operator*(&local_400,*(double *)(&stack0xfffffffffffffc68 + (long)local_39c * 0x20),
                  (ON_3dPoint *)local_98);
      ::operator*(&local_418,M[local_39c][0],(ON_3dPoint *)&Q[0].z);
      ON_3dPoint::operator+(&local_3e8,&local_400,&local_418);
      ::operator*(&local_430,M[local_39c][1],(ON_3dPoint *)&Q[1].z);
      ON_3dPoint::operator+(&local_3d0,&local_3e8,&local_430);
      ::operator*((ON_3dPoint *)&zero_tol,M[local_39c][2],(ON_3dPoint *)&Q[2].z);
      ON_3dPoint::operator+(&local_3b8,&local_3d0,(ON_3dPoint *)&zero_tol);
      pOVar4 = bezCV[cvdex[(long)local_39c + -1].i] + cvdex[(long)local_39c + -1].j;
      pOVar4->x = local_3b8.x;
      pOVar4->y = local_3b8.y;
      pOVar4->z = local_3b8.z;
    }
    dStack_450 = 0.0;
    for (bezP_1.z._4_4_ = 0; bezP_1.z._4_4_ < 4; bezP_1.z._4_4_ = bezP_1.z._4_4_ + 1) {
      ON_3dPoint::ON_3dPoint((ON_3dPoint *)&d_1,0.0,0.0,0.0);
      ON_BezierSurface::Evaluate
                ((ON_BezierSurface *)(b[1] + 3),bezuv[(long)bezP_1.z._4_4_ + -1][1],
                 bezuv[bezP_1.z._4_4_][0],0,3,&d_1);
      dVar6 = ON_3dPoint::DistanceTo
                        ((ON_3dPoint *)&srfP[(long)bezP_1.z._4_4_ + -1].z,(ON_3dPoint *)&d_1);
      dStack_450 = dVar6 + dStack_450;
    }
    if (this->m_cv_count[0] + this->m_cv_count[1] < 0x21) {
      local_760 = g + 1;
    }
    else {
      local_760 = (double **)onmalloc((long)(this->m_cv_count[0] + this->m_cv_count[1]) << 3);
    }
    g[0] = (double *)(local_760 + this->m_cv_count[0]);
    for (k._4_4_ = 0; k._4_4_ < 2; k._4_4_ = k._4_4_ + 1) {
      GetGrevilleAbcissae(this,k._4_4_,(double *)g_buffer[(long)k._4_4_ + -3]);
      if (this->m_order[k._4_4_] == 4) {
        pdVar1 = this->m_knot[k._4_4_];
        if (*pdVar1 < pdVar1[2]) {
          *(double *)g_buffer[(long)k._4_4_ + -3] = pdVar1[2];
          *(double *)((long)g_buffer[(long)k._4_4_ + -3] + 8) =
               (pdVar1[2] + pdVar1[2] + pdVar1[3]) / 3.0;
        }
        iVar3 = this->m_cv_count[k._4_4_];
        iVar5 = iVar3 - this->m_order[k._4_4_];
        if (pdVar1[(long)iVar5 + 3] < pdVar1[(long)iVar5 + 5]) {
          *(double *)((long)g_buffer[(long)k._4_4_ + -3] + (long)(iVar3 + -1) * 8) =
               pdVar1[(long)iVar5 + 3];
          *(double *)((long)g_buffer[(long)k._4_4_ + -3] + (long)(iVar3 + -2) * 8) =
               (pdVar1[(long)iVar5 + 3] + pdVar1[(long)iVar5 + 3] + pdVar1[(long)iVar5 + 2]) / 3.0;
        }
      }
    }
    nurbsP.z = ON_3dPoint::Origin.x;
    _passi = ON_3dPoint::Origin.x;
    nurbsP.x = ON_3dPoint::Origin.y;
    nurbsP.y = ON_3dPoint::Origin.z;
    local_220 = 0;
    n = 0;
    for (t0._4_4_ = 1; t0._4_4_ < this->m_cv_count[0]; t0._4_4_ = t0._4_4_ + 1) {
      for (t0._0_4_ = 0; t0._0_4_ < 2; t0._0_4_ = t0._0_4_ + 1) {
        if (t0._0_4_ == 0) {
          local_770 = (double *)
                      (((double)local_760[t0._4_4_ + -1] + (double)local_760[t0._4_4_]) * 0.5);
        }
        else {
          local_770 = local_760[t0._4_4_];
        }
        dVar6 = ON_Interval::NormalizedParameterAt((ON_Interval *)(c + 3),(double)local_770);
        local_779 = 0.0 < dVar6 && dVar6 < 1.0;
        if (local_779) {
          for (t1._4_4_ = 1; t1._4_4_ < this->m_cv_count[1]; t1._4_4_ = t1._4_4_ + 1) {
            for (t1._0_4_ = 0; t1._0_4_ < 2; t1._0_4_ = t1._0_4_ + 1) {
              if (t1._0_4_ == 0) {
                local_788 = (g[0][t1._4_4_ + -1] + g[0][t1._4_4_]) * 0.5;
              }
              else {
                local_788 = g[0][t1._4_4_];
              }
              dVar7 = ON_Interval::NormalizedParameterAt(&local_a8,local_788);
              local_791 = 0.0 < dVar7 && dVar7 < 1.0;
              if (local_791) {
                ON_BezierSurface::Evaluate((ON_BezierSurface *)(b[1] + 3),dVar6,dVar7,0,3,&nurbsP.z)
                ;
                (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
                          (local_770,this,0,3,&passi,0,&local_220);
                pOVar8 = (ON_NurbsSurface *)
                         ON_3dPoint::DistanceTo((ON_3dPoint *)&passi,(ON_3dPoint *)&nurbsP.z);
                if ((((dStack_450 * 16.0 < (double)pOVar8) && ((double)pOStack_e8 < (double)pOVar8))
                    && (pOStack_e8 = pOVar8, 0.0 <= max_deviation)) &&
                   (max_deviation < (double)pOVar8)) {
                  goto LAB_0077f815;
                }
              }
            }
          }
        }
      }
    }
    this_local = pOStack_e8;
LAB_0077f815:
    ON_BezierSurface::~ON_BezierSurface((ON_BezierSurface *)(b[1] + 3));
  }
  return (double)this_local;
}

Assistant:

double ON_NurbsSurface::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4][4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if ( ThisIsNullptr(false) )
    return failed_rc;
  if (this->m_order[0] < 2 || this->m_order[1] < 2)
    return failed_rc;
  if (this->m_cv_count[0] < this->m_order[0] || this->m_cv_count[0] > 64)
    return failed_rc;
  if (this->m_cv_count[1] < this->m_order[1] || this->m_cv_count[1] > 64)
    return failed_rc;

  ON_3dPoint Q[4];
  
  const ON_Interval domain[2] = { this->Domain(0),this->Domain(1) };
  
  const double c[4] = { domain[1][0],domain[0][1],domain[1][1],domain[0][0] };
  const double maximum_deviation = ON_DBL_QNAN;
  double deviation = 0.0;
  for (int side = 0; side < 4; side++)
  {
    ON_Curve* iso = this->IsoCurve((side%2), c[side]);
    if (nullptr == iso)
      return failed_rc;
    const ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(iso);
    double d
      = (nullptr != nurbs_curve)
      ? nurbs_curve->GetCubicBezierApproximation(
        maximum_deviation,
        (0 == (side % 2)) ? Q : &bezCV[(1 == side) ? 3 : 0][0])
      : ON_DBL_QNAN;
    if (false == (d >= 0.0))
      return failed_rc;
    if (d > deviation)
      deviation = d;
    if (0 == (side % 2))
    {
      int j = (0 == side) ? 0 : 3;
      bezCV[1][j] = Q[1];
      bezCV[2][j] = Q[2];
    }
    delete iso;
  }

  bezCV[1][1] = ON_3dPoint::Origin;
  bezCV[1][2] = ON_3dPoint::Origin;
  bezCV[2][1] = ON_3dPoint::Origin;
  bezCV[2][2] = ON_3dPoint::Origin;

  ON_BezierSurface bezS;
  bezS.m_dim = 3;
  bezS.m_is_rat = 0;
  bezS.m_order[0] = 4;
  bezS.m_order[1] = 4;
  bezS.m_cv_stride[0] = (int)(&bezCV[1][0].x - &bezCV[0][0].x);
  bezS.m_cv_stride[1] = (int)(&bezCV[0][1].x - &bezCV[0][0].x);
  bezS.m_cv = &bezCV[0][0].x;


  // b[0][] = 27*(bernstein cubics at 1/3)
  // b[1][] = 27*(bernstein cubics at 2/3)
  const double b[2][4] = {
    { 8.0, 12.0, 6.0, 1.0 },
    { 1.0, 6.0, 12.0, 8.0 } 
  };

  // uv[4] = {{1/3,1/3}, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // K[n] = (27*27)*bezCV(uv[n])
  // P[n] = this(domain.ParameterAt(uv[n]));
  // 36* M * Transpose[C11,C21,C12,C22] = [X0,X1,X2,X3]
  // uv[4] = {{1/3,1/3{, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // X0 = nurbs_srf(1/3,1/3) - K[0]/(27*27)
  // A[4][4] = 4x4 matrix with rows
  // 36*A[0][] = {b1[1]*b1[1], b1[2]*b1[1], b1[1]*b1[2], b1[2]*b1[2] }
  // 36*A[1][] = {b2[1]*b1[1], b2[2]*b1[1], b2[1]*b1[2], b2[2]*b1[2] }
  // 36*A[2][] = {b1[1]*b2[1], b1[2]*b2[1], b1[1]*b2[2], b1[2]*b2[2] }
  // 36*A[3][] = {b2[1]*b2[1], b2[2]*b2[1], b2[1]*b2[2], b2[2]*b2[2] }
  // K[n] + 36*(A[n][0]*C11 + A[n][1]*C21 + A[n][2]*C12 + A[n][3]*C22) = (27*27)P[n]
  // A*Transpose(C11,C21,C12,C22) = Transpose(X[0],X[1],X[2],X[3])
  // X[n] = ((27*27)P[n] - K[n])/36 = 81/4*P[n] - K[n]/36.0
  // Inverse(A) = M/9.
  // Transpose(C11,C21,C12,C22) = M*Transpose(X[0],X[1],X[2],X[3])/9
  // Q[n] = X[n]/9 = 2.25*P[n] - K[n]/324.0
  // bezCV[cvdex[n].i][cvdex[n].i] = M*Transpose(X[0],X[1],X[2],X[3])/9
  const double bezuv[4][2] =
  {
    {(1.0 / 3.0), (1.0 / 3.0)},
    {(2.0 / 3.0), (1.0 / 3.0)},
    {(1.0 / 3.0), (2.0 / 3.0)},
    {(2.0 / 3.0), (2.0 / 3.0)}
  };
  ON_3dPoint srfP[4] = { ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin };
  int hint[2] = {};
  for (int n = 0; n < 4; n++)
  {
    this->Evaluate(domain[0].ParameterAt(bezuv[n][0]),domain[1].ParameterAt(bezuv[n][1]), 0, 3, &srfP[n].x, 0, hint);
    const double* bi = b[n%2];
    const double* bj = b[n/2];
    ON_3dPoint K(0.0, 0.0, 0.0);
    ON_3dPoint valQ(0, 0, 0);
    for (int i = 0; i < 4; i++) for (int j = 0; j < 4; j++)
    {
      if ((1 == i || 2 == i) && (1 == j || 2 == j))
        continue;
      K += (bi[i] * bj[j])*bezCV[i][j];
    }
    Q[n] = (2.25*srfP[n]) - (K/324.0);
  }

  const ON_2dex cvdex[4]{ON_2dex(1,1),ON_2dex(2,1),ON_2dex(1,2),ON_2dex(2,2)};

  ////const double A[4][4] =
  ////{
  ////  {4.0, 2.0, 2.0, 1.0},
  ////  {2.0, 4.0, 1.0, 2.0},
  ////  {2.0, 1.0, 4.0, 2.0},
  ////  {1.0, 2.0, 2.0, 4.0}
  ////};

  const double M[4][4] =
  {
    {4.0,-2.0,-2.0,1.0},
    {-2.0,4.0,1.0,-2.0},
    {-2.0,1.0,4.0,-2.0},
    {1.0,-2.0,-2.0,4.0}
  };

  for (int n = 0; n < 4; n++)
    bezCV[cvdex[n].i][cvdex[n].j] = M[n][0] * Q[0] + M[n][1] * Q[1] + M[n][2] * Q[2] + M[n][3] * Q[3];

  double zero_tol = 0.0;
  for (int n = 0; n < 4; n++)
  {
    ON_3dPoint bezP(0.0, 0.0, 0.0);
    bezS.Evaluate(bezuv[n][0], bezuv[n][1], 0, 3, &bezP.x);
    double d = srfP[n].DistanceTo(bezP);
    zero_tol += d;
  }
  zero_tol = 16.0*zero_tol;

  double g_buffer[64];
  double* g[2];
  g[0] 
    = (m_cv_count[0] + m_cv_count[1] <= 32)
    ? g_buffer 
    : (double*)onmalloc((m_cv_count[0] + m_cv_count[1]) * sizeof(g[0][0]));
  g[1] = g[0] + m_cv_count[0];
  for (int dir = 0; dir < 2; dir++)
  {
    this->GetGrevilleAbcissae(dir, g[dir]);
    if (4 == this->m_order[dir])
    {
      const double* k = this->m_knot[dir];
      if (k[0] < k[2])
      {
        g[dir][0] = k[2];
        g[dir][1] = (2.0*k[2] + k[3]) / 3.0;
      }
      const int cv_count = this->m_cv_count[dir];
      k += (cv_count - this->m_order[dir]);
      if (k[3] < k[5])
      {
        g[dir][cv_count-1] = k[3];
        g[dir][cv_count-2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  }

  ON_3dPoint bezP(ON_3dPoint::Origin), nurbsP(ON_3dPoint::Origin);
  hint[0] = 0;
  hint[1] = 0;
  for (int i = 1; i < this->m_cv_count[0]; i++)
  {
    for (int passi = 0; passi < 2; passi++)
    {
      const double t0 = (0 == passi) ? 0.5*(g[0][i - 1] + g[0][i]) : g[0][i];
      const double s0 = domain[0].NormalizedParameterAt(t0);
      if (false == (s0 > 0.0 && s0 < 1.0))
        continue;
      for (int j = 1; j < this->m_cv_count[1]; j++)
      {
        for (int passj = 0; passj < 2; passj++)
        {
          const double t1 = (0 == passj) ? 0.5*(g[1][j - 1] + g[1][j]) : g[1][j];
          const double s1 = domain[1].NormalizedParameterAt(t1);
          if (false == (s1 > 0.0 && s1 < 1.0))
            continue;
          bezS.Evaluate(s0,s1, 0, 3, &bezP.x);
          this->Evaluate(t0,t1, 0, 3, &nurbsP.x, 0, hint);
          double d = nurbsP.DistanceTo(bezP);
          if (d > zero_tol && d > deviation)
          {
            deviation = d;
            if (max_deviation >= 0.0 && deviation > max_deviation)
              return failed_rc;
          }
        }
      }
    }
  }

  return deviation;
}